

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printUImm12Offset2(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint id;
  MCOperand *op;
  int64_t iVar4;
  uint8_t *puVar5;
  uint8_t uVar6;
  undefined4 in_register_00000034;
  int iVar7;
  long val;
  
  op = MCInst_getOperand(MI,2);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar4 = MCOperand_getImm(op);
    val = iVar4 * ((ulong)O & 0xffffffff);
    printInt64Bang((SStream *)CONCAT44(in_register_00000034,OpNum),val);
    h = MI->csh;
    if (h->detail != CS_OPT_OFF) {
      iVar7 = (int)val;
      if (h->doing_mem == true) {
        pcVar2 = MI->flat_insn->detail;
        *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x3d) = iVar7;
      }
      else {
        id = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar5 = AArch64_get_op_access(h,id);
        uVar6 = '\0';
        if (puVar5[bVar1] != 0x80) {
          uVar6 = puVar5[bVar1];
        }
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar5 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar5[0] = '\x02';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar7;
        puVar5 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar5 = *puVar5 + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void printUImm12Offset2(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	printUImm12Offset(MI, OpNum, Scale, O);
}